

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack12(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[2];
  *out = (uint)uVar1 << 0x18 | ((uint)in[1] & 0xfff) << 0xc | (uint)*in & 0xfff;
  out[1] = (uint)uVar1 >> 8 & 0xf;
  Unroller<(unsigned_short)12,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack12(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<12>::Pack(in, out);
}